

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O0

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int sh;
  int n;
  uint8_t b;
  uint8_t m;
  uint8_t *p;
  lword d_local;
  int siz_local;
  int pos_local;
  int fldsiz_local;
  void *dst_local;
  bool be_local;
  
  if (be == 0) {
    iVar3 = fldsiz - (pos + siz + 7 >> 3);
  }
  else {
    iVar3 = pos + siz + 7 >> 3;
  }
  p = (uint8_t *)((long)dst + (long)iVar3);
  cVar1 = (char)(pos & 7U);
  bVar2 = 8 - (cVar1 + (char)siz & 7U) & 7;
  m = (uint8_t)(0xff << bVar2);
  d_local = d << bVar2;
  n = (int)((pos & 7U) + siz + 7) >> 3;
  while (n != 0) {
    if (n + -1 == 0) {
      m = m & (char)(1 << (8U - cVar1 & 0x1f)) - 1U;
    }
    if (be == 0) {
      *p = *p & (m ^ 0xff) | (byte)d_local & m;
      p = p + 1;
    }
    else {
      p[-1] = p[-1] & (m ^ 0xff) | (byte)d_local & m;
      p = p + -1;
    }
    d_local = d_local >> 8;
    m = 0xff;
    n = n + -1;
  }
  return;
}

Assistant:

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)
/* write value to bitfield with length fldsiz, starting at bit-position pos */
{
  uint8_t *p = dst;
  uint8_t m,b;
  int n,sh;

  /* advance to start-byte (LSB) */
  if (be)
    p += (pos + siz + 7) >> 3;
  else
    p += fldsiz - ((pos + siz + 7) >> 3);

  pos &= 7;
  n = (pos + siz + 7) >> 3;  /* number of bytes to write */

  sh = (8 - ((pos + siz) & 7)) & 7;
  m = 0xff << sh;  /* initial mask for LSB */
  d <<= sh;  /* shift value to match bitfield */

  while (n--) {
    if (n == 0)
      m &= (1 << (8 - pos)) - 1;  /* apply mask for MSB */

    if (be) {
      /* write right to left, for big-endian target */
      b = *(--p) & ~m;
      *p = b | ((uint8_t)d & m);
    }
    else {
      /* write left to right, for little-endian target */
      b = *p & ~m;
      *p++ = b | ((uint8_t)d & m);
    }
    d >>= 8;
    m = 0xff;
  }
}